

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> __thiscall
deqp::egl::GLES2ThreadTest::EGLResourceManager::popContext(EGLResourceManager *this,int index)

{
  reference other;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
  *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> SVar1;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>_>
  local_38;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>_>
  local_30;
  const_iterator local_28;
  undefined1 local_1d;
  int local_1c;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
  *pvStack_18;
  int index_local;
  EGLResourceManager *this_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *context;
  
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
             *)CONCAT44(in_register_00000034,index);
  local_1d = 0;
  local_1c = in_EDX;
  pvStack_18 = this_00;
  this_local = this;
  other = std::
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
          ::operator[](this_00,(long)in_EDX);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)this,other);
  local_38._M_current =
       (SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)
       std::
       vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
       ::begin(this_00);
  local_30 = __gnu_cxx::
             __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>_>
             ::operator+(&local_38,(long)local_1c);
  __gnu_cxx::
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>>>>
  ::__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>*>
            ((__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>>>>
              *)&local_28,&local_30);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
  ::erase(this_00,local_28);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (GLES2Context *)this;
  return SVar1;
}

Assistant:

SharedPtr<GLES2Context> EGLResourceManager::popContext (int index)
{
	SharedPtr<GLES2Context> context = m_contexts[index];
	m_contexts.erase(m_contexts.begin() + index);
	return context;
}